

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint ON_SubDEdgeChain::RefineEdgeChains
               (ON_SimpleArray<ON_SubDEdgePtr> *unconditional_edge_chains,bool bOrdinarySmoothChains
               ,bool bOrdinaryCreaseChains,ON_SimpleArray<ON_SubDEdgePtr> *refined_edge_chains)

{
  ON_SubDEdgeTag OVar1;
  unsigned_short uVar2;
  uint uVar3;
  long lVar4;
  ON_SubDEdgeSharpness OVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ON_SubDEdge *pOVar9;
  uint uVar10;
  uint uVar11;
  ON_SubDEdgePtr eptr;
  ON_SimpleArray<ON_SubDEdgePtr> local_unconditional_edge_chains;
  float local_68;
  ON_SubDEdgePtr local_58;
  uint local_4c;
  ON_SimpleArray<ON_SubDEdgePtr> local_48;
  
  uVar3 = unconditional_edge_chains->m_count;
  if ((uVar3 == 0) || (unconditional_edge_chains->m_a != refined_edge_chains->m_a)) {
    if (((ulong)(uint)refined_edge_chains->m_count != 0) &&
       (7 < refined_edge_chains->m_a[(ulong)(uint)refined_edge_chains->m_count - 1].m_ptr)) {
      ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&ON_SubDEdgePtr::Null);
    }
    uVar8 = 0;
    uVar10 = 0;
    uVar11 = 0;
    while (uVar11 < uVar3) {
      local_48._vptr_ON_SimpleArray = (_func_int **)unconditional_edge_chains->m_a[uVar11].m_ptr;
      pOVar9 = (ON_SubDEdge *)((ulong)local_48._vptr_ON_SimpleArray & 0xfffffffffffffff8);
      if (pOVar9 != (ON_SubDEdge *)0x0) {
        local_4c = uVar10;
        ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,(ON_SubDEdgePtr *)&local_48);
        OVar1 = pOVar9->m_edge_tag;
        uVar2 = pOVar9->m_face_count;
        if (((OVar1 == SmoothX) || (OVar1 == Smooth)) &&
           (bVar6 = ON_SubDEdge::IsSharp(pOVar9), bVar6)) {
          OVar5 = ON_SubDEdgePtr::RelativeSharpness((ON_SubDEdgePtr *)&local_48,false);
          local_68 = OVar5.m_edge_sharpness[1];
          bVar6 = true;
        }
        else {
          local_68 = 0.0;
          bVar6 = false;
        }
        for (uVar10 = uVar11 + 2; uVar8 = uVar10 - 1, uVar8 < uVar3; uVar10 = uVar10 + 1) {
          local_58.m_ptr = unconditional_edge_chains->m_a[uVar8].m_ptr;
          pOVar9 = (ON_SubDEdge *)(local_58.m_ptr & 0xfffffffffffffff8);
          if (((pOVar9 == (ON_SubDEdge *)0x0) || (uVar2 != pOVar9->m_face_count)) ||
             ((OVar1 == Smooth || OVar1 == SmoothX) !=
              (pOVar9->m_edge_tag == SmoothX || pOVar9->m_edge_tag == Smooth))) {
LAB_005f0da1:
            uVar8 = uVar10 - 1;
            break;
          }
          if (bVar6) {
            bVar7 = ON_SubDEdge::IsSharp(pOVar9);
            if (bVar7) {
              OVar5 = ON_SubDEdgePtr::RelativeSharpness(&local_58,false);
              bVar7 = NAN(local_68);
              if ((local_68 == OVar5.m_edge_sharpness[0]) &&
                 (local_68 = OVar5.m_edge_sharpness[1], !bVar7 && !NAN(OVar5.m_edge_sharpness[0])))
              goto LAB_005f0d38;
            }
            goto LAB_005f0da1;
          }
LAB_005f0d38:
          ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&local_58);
          uVar8 = uVar10;
          if (((local_58.m_ptr & 0xfffffffffffffff8) == 0) ||
             (lVar4 = *(long *)((local_58.m_ptr & 0xfffffffffffffff8) + 0x80 +
                               (ulong)(~(uint)local_58.m_ptr & 1) * 8), lVar4 == 0)) break;
          if ((OVar1 == SmoothX) || (OVar1 == Smooth)) {
            if ((bOrdinarySmoothChains) &&
               ((*(char *)(lVar4 + 0x60) != '\x01' || ((!bVar6 && (*(short *)(lVar4 + 0x68) != 4))))
               )) break;
          }
          else if ((bOrdinaryCreaseChains) && (*(char *)(lVar4 + 0x60) != '\x02')) break;
        }
        uVar10 = local_4c + 1;
        ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&ON_SubDEdgePtr::Null);
      }
      bVar6 = uVar11 < uVar8;
      uVar11 = uVar11 + 1;
      if (bVar6) {
        uVar11 = uVar8;
      }
    }
  }
  else {
    ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray(&local_48,unconditional_edge_chains);
    if (-1 < refined_edge_chains->m_capacity) {
      refined_edge_chains->m_count = 0;
    }
    uVar10 = RefineEdgeChains(&local_48,bOrdinarySmoothChains,bOrdinaryCreaseChains,
                              refined_edge_chains);
    ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_48);
  }
  return uVar10;
}

Assistant:

unsigned ON_SubDEdgeChain::RefineEdgeChains(
  const ON_SimpleArray<ON_SubDEdgePtr>& unconditional_edge_chains,
  bool bOrdinarySmoothChains,
  bool bOrdinaryCreaseChains,
  ON_SimpleArray<ON_SubDEdgePtr>& refined_edge_chains
)
{
  const unsigned unconditional_edge_count = unconditional_edge_chains.UnsignedCount();

  if (unconditional_edge_count > 0 && unconditional_edge_chains.Array() == refined_edge_chains.Array())
  {
    // copy unconditional_edge_chains[] to a local array so we can modify refined_edge_chains[]
    const ON_SimpleArray<ON_SubDEdgePtr> local_unconditional_edge_chains(unconditional_edge_chains);
    refined_edge_chains.SetCount(0); // In this uniquecase we do not append because in[ut array = output array.
    return ON_SubDEdgeChain::RefineEdgeChains(
      local_unconditional_edge_chains,
      bOrdinarySmoothChains,
      bOrdinaryCreaseChains,
      refined_edge_chains
    );
  }

  if (refined_edge_chains.UnsignedCount() > 0 && refined_edge_chains.Last()->IsNotNull())
  {
    // Append a null separator to refined_edge_chains[].
    refined_edge_chains.Append(ON_SubDEdgePtr::Null);
  }

  unsigned int refined_chain_count = 0;
  unsigned i1 = 0U;
  for (unsigned i0 = 0; i0 < unconditional_edge_count; i0 = (i0 < i1) ? i1 : (i0 + 1U))
  {
    const ON_SubDEdgePtr eptr0 = unconditional_edge_chains[i0];
    const ON_SubDEdge* e0 = eptr0.Edge();
    if (nullptr == e0)
      continue;

    refined_edge_chains.Append(eptr0);

    const unsigned short edge_face_count = e0->m_face_count;
    const bool bSmoothChain = e0->IsSmooth();
    const bool bSharpChain = bSmoothChain ? e0->IsSharp() : false;
    ON_SubDEdgeSharpness prev_sharpness = bSharpChain ? eptr0.RelativeSharpness(false) : ON_SubDEdgeSharpness::Smooth;

    for (i1 = i0 + 1; i1 < unconditional_edge_count; ++i1)
    {
      const ON_SubDEdgePtr eptr = unconditional_edge_chains[i1];
      const ON_SubDEdge* e = eptr.Edge();
      if (nullptr == e)
        break;
      if (edge_face_count != e->m_face_count)
        break;
      if (bSmoothChain != e->IsSmooth())
        break;
      if (bSharpChain)
      {
        if (false == e->IsSharp())
          break;
        const ON_SubDEdgeSharpness s = eptr.RelativeSharpness(false);
        if (false == (prev_sharpness.EndSharpness(1) == s.EndSharpness(0)))
          break;
        prev_sharpness = s;
      }

      // Add eptr to current chain
      refined_edge_chains.Append(eptr);

      const ON_SubDVertex* v = eptr.RelativeVertex(1);
      if (nullptr == v)
      {
        ++i1;
        break;
      }

      if (bSmoothChain)
      {
        if (false == bOrdinarySmoothChains)
          continue;
        if (false == v->IsSmooth())
        {
          ++i1;
          break;
        }        
        if (false == bSharpChain && 4 != v->m_edge_count)
        {
          ++i1;
          break;
        }
      }
      else
      {
        if (false == bOrdinaryCreaseChains)
          continue;
        if (false == v->IsCrease())
        {
          ++i1;
          break;
        }
      }
    }

    // finished with this chain.
    ++refined_chain_count;
    refined_edge_chains.Append(ON_SubDEdgePtr::Null);
  }

  return refined_chain_count;
}